

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O0

int Mvc_CoverBestLiteral(Mvc_Cover_t *pCover,Mvc_Cube_t *pMask)

{
  int local_40;
  int fUseFirst;
  int nLitsCur;
  int nLitsMax;
  int iMax;
  int i;
  int nBit;
  int nWord;
  Mvc_Cube_t *pCube;
  Mvc_Cube_t *pMask_local;
  Mvc_Cover_t *pCover_local;
  
  nLitsCur = -1;
  fUseFirst = -1;
  for (nLitsMax = 0; nLitsMax < pCover->nBits; nLitsMax = nLitsMax + 1) {
    if ((pMask == (Mvc_Cube_t *)0x0) ||
       ((pMask->pData[nLitsMax >> 5] & 1 << ((byte)nLitsMax & 0x1f)) != 0)) {
      local_40 = 0;
      for (_nBit = (pCover->lCubes).pHead; _nBit != (Mvc_Cube_t *)0x0; _nBit = _nBit->pNext) {
        if ((_nBit->pData[nLitsMax >> 5] & 1 << ((byte)nLitsMax & 0x1f)) != 0) {
          local_40 = local_40 + 1;
        }
      }
      if (fUseFirst < local_40) {
        fUseFirst = local_40;
        nLitsCur = nLitsMax;
      }
    }
  }
  if (fUseFirst < 2) {
    pCover_local._4_4_ = -1;
  }
  else {
    pCover_local._4_4_ = nLitsCur;
  }
  return pCover_local._4_4_;
}

Assistant:

int Mvc_CoverBestLiteral( Mvc_Cover_t * pCover, Mvc_Cube_t * pMask )
{
    Mvc_Cube_t * pCube;
    int nWord, nBit;
    int i, iMax, nLitsMax, nLitsCur;
    int fUseFirst = 1;

    // go through each literal
    iMax = -1;
    nLitsMax = -1;
    for ( i = 0; i < pCover->nBits; i++ )
        if ( !pMask || Mvc_CubeBitValue(pMask,i) )
        {
            // get the word and bit of this literal
            nWord = Mvc_CubeWhichWord(i);
            nBit  = Mvc_CubeWhichBit(i);
            // go through all the cubes
            nLitsCur = 0;
            Mvc_CoverForEachCube( pCover, pCube )
                if ( pCube->pData[nWord] & (1<<nBit) )
                    nLitsCur++;

            // check if this is the best literal
            if ( fUseFirst )
            {
                if ( nLitsMax < nLitsCur )
                {
                    nLitsMax = nLitsCur;
                    iMax = i;
                }
            }
            else
            {
                if ( nLitsMax <= nLitsCur )
                {
                    nLitsMax = nLitsCur;
                    iMax = i;
                }
            }
        }

    if ( nLitsMax > 1 )
        return iMax;
    return -1;
}